

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

double __thiscall AmpIO::GetMotorVoltageRatio(AmpIO *this,uint index)

{
  uint32_t uVar1;
  short local_20;
  int16_t raw;
  quadlet_t buff;
  uint index_local;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (uVar1 == 0x64524131) {
    if (index < this->NumMotors) {
      local_20 = (short)this->ReadBuffer[index + this->MOTOR_STATUS_OFFSET];
      this_local = (AmpIO *)(double)((float)((int)local_20 >> 5) / 1023.0);
    }
    else {
      this_local = (AmpIO *)0x0;
    }
  }
  else {
    this_local = (AmpIO *)0x0;
  }
  return (double)this_local;
}

Assistant:

double AmpIO::GetMotorVoltageRatio(unsigned int index) const
{
    if (GetHardwareVersion() != dRA1_String)
        return 0.0;

    if (index >= NumMotors) {
        return 0.0;
    }
    quadlet_t buff;
    buff = ReadBuffer[index+MOTOR_STATUS_OFFSET];
    int16_t raw = buff & 0xffff;
    return (raw >> 5) / 1023.0l;
}